

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::start_natpmp
          (session_impl *this,shared_ptr<libtorrent::aux::listen_socket_t> *s)

{
  session_impl *__args_1;
  bool bVar1;
  element_type *peVar2;
  char *__src;
  element_type *this_00;
  byte local_241;
  bool local_231;
  address local_230;
  undefined1 local_210 [8];
  ip_interface ip;
  shared_ptr<libtorrent::aux::listen_socket_t> local_70;
  listen_socket_handle local_60;
  io_context local_50;
  undefined1 local_3e;
  uchar local_3d;
  bitfield_flag local_3c;
  undefined1 local_3b;
  uchar local_3a;
  bitfield_flag local_39;
  address local_38;
  __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_18;
  shared_ptr<libtorrent::aux::listen_socket_t> *s_local;
  session_impl *this_local;
  
  local_18 = (__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)s;
  s_local = (shared_ptr<libtorrent::aux::listen_socket_t> *)this;
  peVar2 = ::std::
           __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)s);
  bVar1 = is_v6<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>(&peVar2->local_endpoint);
  local_231 = false;
  if (bVar1) {
    peVar2 = ::std::
             __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_18);
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
              (&local_38,&peVar2->local_endpoint);
    local_231 = is_local(&local_38);
  }
  if (local_231 == false) {
    peVar2 = ::std::
             __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_18);
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar2->natpmp_mapper);
    local_241 = 0;
    if (!bVar1) {
      peVar2 = ::std::
               __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_18);
      local_3a = (peVar2->flags).m_val;
      local_3b = 2;
      local_39 = (bitfield_flag)
                 libtorrent::flags::operator&
                           ((bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                             )local_3a,
                            (bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                             )0x2);
      bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_39);
      local_241 = 0;
      if (!bVar1) {
        peVar2 = ::std::
                 __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_18);
        local_3d = (peVar2->flags).m_val;
        local_3e = 8;
        local_3c = (bitfield_flag)
                   libtorrent::flags::operator&
                             ((bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                               )local_3d,
                              (bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                               )0x8);
        bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_3c);
        local_241 = bVar1 ^ 0xff;
      }
    }
    if ((local_241 & 1) != 0) {
      __args_1 = (session_impl *)this->m_io_context;
      ::std::shared_ptr<libtorrent::aux::listen_socket_t>::shared_ptr
                (&local_70,(shared_ptr<libtorrent::aux::listen_socket_t> *)local_18);
      listen_socket_handle::listen_socket_handle(&local_60,&local_70);
      ::std::
      make_shared<libtorrent::natpmp,boost::asio::io_context&,libtorrent::aux::session_impl&,libtorrent::aux::listen_socket_handle>
                (&local_50,__args_1,(listen_socket_handle *)this);
      peVar2 = ::std::
               __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_18);
      ::std::shared_ptr<libtorrent::natpmp>::operator=
                (&peVar2->natpmp_mapper,(shared_ptr<libtorrent::natpmp> *)&local_50);
      ::std::shared_ptr<libtorrent::natpmp>::~shared_ptr
                ((shared_ptr<libtorrent::natpmp> *)&local_50);
      listen_socket_handle::~listen_socket_handle(&local_60);
      ::std::shared_ptr<libtorrent::aux::listen_socket_t>::~shared_ptr(&local_70);
      ip_interface::ip_interface((ip_interface *)local_210);
      peVar2 = ::std::
               __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_18);
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                (&local_230,&peVar2->local_endpoint);
      boost::asio::ip::address::operator=((address *)local_210,&local_230);
      peVar2 = ::std::
               __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_18);
      boost::asio::ip::address::operator=
                ((address *)&ip.interface_address.ipv6_address_.scope_id_,&peVar2->netmask);
      ::std::
      __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->(local_18);
      __src = (char *)::std::__cxx11::string::c_str();
      strncpy((char *)&ip.netmask.ipv6_address_.scope_id_,__src,0x3f);
      ip.name[0x37] = '\0';
      peVar2 = ::std::
               __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_18);
      this_00 = ::std::
                __shared_ptr_access<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&peVar2->natpmp_mapper);
      natpmp::start(this_00,(ip_interface *)local_210);
    }
  }
  return;
}

Assistant:

void session_impl::start_natpmp(std::shared_ptr<aux::listen_socket_t> const& s)
	{
		// don't create mappings for local IPv6 addresses
		// they can't be reached from outside of the local network anyways
		if (is_v6(s->local_endpoint) && is_local(s->local_endpoint.address()))
			return;

		if (!s->natpmp_mapper
			&& !(s->flags & listen_socket_t::local_network)
			&& !(s->flags & listen_socket_t::proxy))
		{
			// the natpmp constructor may fail and call the callbacks
			// into the session_impl.
			s->natpmp_mapper = std::make_shared<natpmp>(m_io_context, *this, listen_socket_handle(s));
			ip_interface ip;
			ip.interface_address = s->local_endpoint.address();
			ip.netmask = s->netmask;
			std::strncpy(ip.name, s->device.c_str(), sizeof(ip.name) - 1);
			ip.name[sizeof(ip.name) - 1] = '\0';
			s->natpmp_mapper->start(ip);
		}
	}